

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O0

int mtrShiftHL(MtrNode *node,int shift)

{
  MtrHalfWord MVar1;
  int iVar2;
  MtrNode *pMStack_28;
  int low;
  MtrNode *auxnode;
  int shift_local;
  MtrNode *node_local;
  
  MVar1 = shift + node->low;
  if (((int)MVar1 < 0) || (0x7fffffff < (int)(MVar1 + (node->size - 1)))) {
    node_local._4_4_ = 0;
  }
  else {
    node->low = MVar1;
    if (((node->flags & 1) == 0) && (node->child != (MtrNode *)0x0)) {
      pMStack_28 = node->child;
      do {
        iVar2 = mtrShiftHL(pMStack_28,shift);
        if (iVar2 == 0) {
          return 0;
        }
        pMStack_28 = pMStack_28->younger;
      } while (pMStack_28 != (MtrNode *)0x0);
    }
    node_local._4_4_ = 1;
  }
  return node_local._4_4_;
}

Assistant:

static int
mtrShiftHL(
  MtrNode * node /* group tree node */,
  int  shift /* amount by which low should be changed */)
{
    MtrNode *auxnode;
    int low;

    low = (int) node->low;


    low += shift;

    if (low < 0 || low + (int) (node->size - 1) > (int) MTR_MAXHIGH) return(0);

    node->low = (MtrHalfWord) low;

    if (!MTR_TEST(node,MTR_TERMINAL) && node->child != NULL) {
        auxnode = node->child;
        do {
            if (!mtrShiftHL(auxnode,shift)) return(0);
            auxnode = auxnode->younger;
        } while (auxnode != NULL);
    }

    return(1);

}